

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by.hpp
# Opt level: O0

tuple<int_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&&>
* __thiscall
burst::detail::
by_impl<1ul,0ul,2ul,DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0&,std::tuple<int&&,int&&,int&&>>
          (tuple<int_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&&>
           *__return_storage_ptr__,detail *this,tuple<int_&&,_int_&&,_int_&&> *param_3)

{
  tuple<int_&&,_int_&&,_int_&&> *this_00;
  int *__elements;
  int *piVar1;
  string local_48;
  tuple<int_&&,_int_&&,_int_&&> *local_28;
  tuple<int_&&,_int_&&,_int_&&> *t_local;
  anon_class_1_0_00000001_for_f *f_local;
  tuple<int_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&&>
  *local_10;
  
  local_28 = param_3;
  t_local = (tuple<int_&&,_int_&&,_int_&&> *)this;
  local_10 = __return_storage_ptr__;
  __elements = std::get<0ul,int&&,int&&,int&&>(param_3);
  this_00 = t_local;
  piVar1 = std::get<1ul,int&&,int&&,int&&>(local_28);
  DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::$_0::operator()(&local_48,(__0 *)this_00,*piVar1);
  piVar1 = std::get<2ul,int&&,int&&,int&&>(local_28);
  std::
  tuple<int_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&&>
  ::
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true,_true>
            (__return_storage_ptr__,__elements,&local_48,piVar1);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto)
            by_impl
            (
                std::index_sequence<BeforeIndex...>,
                std::index_sequence<AfterIndex...>,
                UnaryFunction && f,
                Tuple && t
            )
        {
            return
                std::tuple
                <
                    std::tuple_element_t<BeforeIndex, std::decay_t<Tuple>>...,
                    invoke_result_t<UnaryFunction, std::tuple_element_t<Index, std::decay_t<Tuple>>>,
                    std::tuple_element_t<AfterIndex, std::decay_t<Tuple>>...
                >
                (
                    std::get<BeforeIndex>(std::forward<Tuple>(t))...,
                    std::forward<UnaryFunction>(f)(std::get<Index>(std::forward<Tuple>(t))),
                    std::get<AfterIndex>(std::forward<Tuple>(t))...
                );
        }